

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

ssize_t __thiscall
kj::FileOutputStream::write(FileOutputStream *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  undefined4 in_register_00000034;
  long lVar2;
  long lVar3;
  undefined8 *puVar4;
  
  lVar2 = CONCAT44(in_register_00000034,__fd);
  if (__n != 0) {
    puVar4 = (undefined8 *)(__n * 0x10 + (long)__buf);
    lVar3 = *(long *)(lVar2 + 0x10);
    do {
      lVar1 = *(long *)((long)__buf + 8);
      (**(code **)(**(long **)(lVar2 + 8) + 0x48))(*(long **)(lVar2 + 8),lVar3,*__buf,lVar1);
      lVar3 = lVar1 + *(long *)(lVar2 + 0x10);
      *(long *)(lVar2 + 0x10) = lVar3;
      __buf = (void *)((long)__buf + 0x10);
    } while ((undefined8 *)__buf != puVar4);
  }
  kj::_::readyNow();
  return (ssize_t)this;
}

Assistant:

Promise<void> FileOutputStream::write(ArrayPtr<const ArrayPtr<const byte>> pieces) {
  // TODO(perf): Extend kj::File with an array-of-arrays write?
  for (auto piece: pieces) {
    file.write(offset, piece);
    offset += piece.size();
  }
  return kj::READY_NOW;
}